

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secure.h
# Opt level: O2

secure_unique_ptr<std::array<unsigned_char,_96UL>_>
make_secure_unique<std::array<unsigned_char,96ul>>(void)

{
  array<unsigned_char,_96UL> *paVar1;
  __uniq_ptr_data<std::array<unsigned_char,_96UL>,_SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>,_true,_true>
  in_RDI;
  long in_FS_OFFSET;
  secure_allocator<std::array<unsigned_char,_96UL>_> local_11;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  paVar1 = secure_allocator<std::array<unsigned_char,_96UL>_>::allocate(&local_11,1);
  paVar1->_M_elems[0x50] = '\0';
  paVar1->_M_elems[0x51] = '\0';
  paVar1->_M_elems[0x52] = '\0';
  paVar1->_M_elems[0x53] = '\0';
  paVar1->_M_elems[0x54] = '\0';
  paVar1->_M_elems[0x55] = '\0';
  paVar1->_M_elems[0x56] = '\0';
  paVar1->_M_elems[0x57] = '\0';
  paVar1->_M_elems[0x58] = '\0';
  paVar1->_M_elems[0x59] = '\0';
  paVar1->_M_elems[0x5a] = '\0';
  paVar1->_M_elems[0x5b] = '\0';
  paVar1->_M_elems[0x5c] = '\0';
  paVar1->_M_elems[0x5d] = '\0';
  paVar1->_M_elems[0x5e] = '\0';
  paVar1->_M_elems[0x5f] = '\0';
  paVar1->_M_elems[0x40] = '\0';
  paVar1->_M_elems[0x41] = '\0';
  paVar1->_M_elems[0x42] = '\0';
  paVar1->_M_elems[0x43] = '\0';
  paVar1->_M_elems[0x44] = '\0';
  paVar1->_M_elems[0x45] = '\0';
  paVar1->_M_elems[0x46] = '\0';
  paVar1->_M_elems[0x47] = '\0';
  paVar1->_M_elems[0x48] = '\0';
  paVar1->_M_elems[0x49] = '\0';
  paVar1->_M_elems[0x4a] = '\0';
  paVar1->_M_elems[0x4b] = '\0';
  paVar1->_M_elems[0x4c] = '\0';
  paVar1->_M_elems[0x4d] = '\0';
  paVar1->_M_elems[0x4e] = '\0';
  paVar1->_M_elems[0x4f] = '\0';
  paVar1->_M_elems[0x30] = '\0';
  paVar1->_M_elems[0x31] = '\0';
  paVar1->_M_elems[0x32] = '\0';
  paVar1->_M_elems[0x33] = '\0';
  paVar1->_M_elems[0x34] = '\0';
  paVar1->_M_elems[0x35] = '\0';
  paVar1->_M_elems[0x36] = '\0';
  paVar1->_M_elems[0x37] = '\0';
  paVar1->_M_elems[0x38] = '\0';
  paVar1->_M_elems[0x39] = '\0';
  paVar1->_M_elems[0x3a] = '\0';
  paVar1->_M_elems[0x3b] = '\0';
  paVar1->_M_elems[0x3c] = '\0';
  paVar1->_M_elems[0x3d] = '\0';
  paVar1->_M_elems[0x3e] = '\0';
  paVar1->_M_elems[0x3f] = '\0';
  paVar1->_M_elems[0x20] = '\0';
  paVar1->_M_elems[0x21] = '\0';
  paVar1->_M_elems[0x22] = '\0';
  paVar1->_M_elems[0x23] = '\0';
  paVar1->_M_elems[0x24] = '\0';
  paVar1->_M_elems[0x25] = '\0';
  paVar1->_M_elems[0x26] = '\0';
  paVar1->_M_elems[0x27] = '\0';
  paVar1->_M_elems[0x28] = '\0';
  paVar1->_M_elems[0x29] = '\0';
  paVar1->_M_elems[0x2a] = '\0';
  paVar1->_M_elems[0x2b] = '\0';
  paVar1->_M_elems[0x2c] = '\0';
  paVar1->_M_elems[0x2d] = '\0';
  paVar1->_M_elems[0x2e] = '\0';
  paVar1->_M_elems[0x2f] = '\0';
  paVar1->_M_elems[0x10] = '\0';
  paVar1->_M_elems[0x11] = '\0';
  paVar1->_M_elems[0x12] = '\0';
  paVar1->_M_elems[0x13] = '\0';
  paVar1->_M_elems[0x14] = '\0';
  paVar1->_M_elems[0x15] = '\0';
  paVar1->_M_elems[0x16] = '\0';
  paVar1->_M_elems[0x17] = '\0';
  paVar1->_M_elems[0x18] = '\0';
  paVar1->_M_elems[0x19] = '\0';
  paVar1->_M_elems[0x1a] = '\0';
  paVar1->_M_elems[0x1b] = '\0';
  paVar1->_M_elems[0x1c] = '\0';
  paVar1->_M_elems[0x1d] = '\0';
  paVar1->_M_elems[0x1e] = '\0';
  paVar1->_M_elems[0x1f] = '\0';
  paVar1->_M_elems[0] = '\0';
  paVar1->_M_elems[1] = '\0';
  paVar1->_M_elems[2] = '\0';
  paVar1->_M_elems[3] = '\0';
  paVar1->_M_elems[4] = '\0';
  paVar1->_M_elems[5] = '\0';
  paVar1->_M_elems[6] = '\0';
  paVar1->_M_elems[7] = '\0';
  paVar1->_M_elems[8] = '\0';
  paVar1->_M_elems[9] = '\0';
  paVar1->_M_elems[10] = '\0';
  paVar1->_M_elems[0xb] = '\0';
  paVar1->_M_elems[0xc] = '\0';
  paVar1->_M_elems[0xd] = '\0';
  paVar1->_M_elems[0xe] = '\0';
  paVar1->_M_elems[0xf] = '\0';
  *(array<unsigned_char,_96UL> **)
   in_RDI.
   super___uniq_ptr_impl<std::array<unsigned_char,_96UL>,_SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_std::array<unsigned_char,_96UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>_>
   .super__Head_base<0UL,_std::array<unsigned_char,_96UL>_*,_false>._M_head_impl = paVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (__uniq_ptr_data<std::array<unsigned_char,_96UL>,_SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>,_true,_true>
            )(tuple<std::array<unsigned_char,_96UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>_>
              )in_RDI.
               super___uniq_ptr_impl<std::array<unsigned_char,_96UL>,_SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::array<unsigned_char,_96UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>_>
               .super__Head_base<0UL,_std::array<unsigned_char,_96UL>_*,_false>._M_head_impl;
  }
  __stack_chk_fail();
}

Assistant:

secure_unique_ptr<T> make_secure_unique(Args&&... as)
{
    T* p = secure_allocator<T>().allocate(1);

    // initialize in place, and return as secure_unique_ptr
    try {
        return secure_unique_ptr<T>(new (p) T(std::forward(as)...));
    } catch (...) {
        secure_allocator<T>().deallocate(p, 1);
        throw;
    }
}